

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O2

void __thiscall
RK_Individual::geraPesosConfInicial(RK_Individual *this,int *idsAbertos,int n,Graph *g)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  double *pdVar3;
  int iVar4;
  Edge **ppEVar5;
  ulong uVar6;
  ulong uVar7;
  
  resetaPesos(this,1.0);
  uVar7 = (ulong)(uint)n;
  iVar4 = 0;
  if (n < 1) {
    uVar7 = 0;
    iVar4 = 0;
  }
  while (pVVar1 = g->verticesList, pVVar1 != (Vertex *)0x0) {
    ppEVar5 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar5, pEVar2 != (Edge *)0x0) {
      if ((pEVar2->modifiable == true) && (pEVar2->marked == true)) {
        pdVar3 = this->weights;
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          if (pEVar2->id == idsAbertos[uVar6]) {
            pdVar3[iVar4] = 0.0;
          }
        }
        iVar4 = iVar4 + 1;
      }
      ppEVar5 = &pEVar2->nextEdge;
    }
    g = (Graph *)&pVVar1->nextVertex;
  }
  return;
}

Assistant:

void RK_Individual::geraPesosConfInicial(int *idsAbertos, int n, Graph *g){

//    cout << "vai gerar conf inicial:\n--------------------------------" << endl;

//    cout << "idsAberto = {" << endl;
//    for(int i=0; i<n; i++)
//        cout << idsAbertos[i] << endl;
//    cout << "}" << endl;

    this->resetaPesos(1.0);
    int j=0;
    for(Vertex *no = g->get_verticesList(); no != NULL; no= no->getNext()){

        for(Edge *a = no->getEdgesList(); a != NULL; a= a->getNext()){

            if(a->getModifiable() == true && a->getMarked() == true){
                for(int i=0; i<n; i++){
                    if(a->getID()==idsAbertos[i]){
                        this->weights[j] = 0.0;
//                            cout << "A{" <<a->getID() << "}" << endl;
                    }
                }
                j++;
            }

        }
    }
//    cout << "--------------------------------" << endl;
}